

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::FindFile
                   (string *__return_storage_ptr__,string *name,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *userPaths,bool no_system_path)

{
  bool bVar1;
  ulong uVar2;
  allocator local_59;
  undefined4 local_58;
  undefined1 local_48 [8];
  string tryPath;
  bool no_system_path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *userPaths_local;
  string *name_local;
  
  tryPath.field_2._M_local_buf[0xf] = no_system_path;
  FindName((string *)local_48,name,userPaths,no_system_path);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = FileIsDirectory((string *)local_48);
    if (!bVar1) {
      CollapseFullPath(__return_storage_ptr__,(string *)local_48);
      goto LAB_0011c198;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
LAB_0011c198:
  local_58 = 1;
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools
::FindFile(const std::string& name,
           const std::vector<std::string>& userPaths,
           bool no_system_path)
{
  std::string tryPath = SystemTools::FindName(name, userPaths, no_system_path);
  if(!tryPath.empty() && !SystemTools::FileIsDirectory(tryPath))
    {
    return SystemTools::CollapseFullPath(tryPath);
    }
  // Couldn't find the file.
  return "";
}